

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

PaError PaAlsaStreamComponent_InitialConfigure
                  (PaAlsaStreamComponent *self,PaStreamParameters *params,int primeBuffers,
                  snd_pcm_hw_params_t *hwParams,double *sampleRate)

{
  snd_pcm_t *pcm;
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined4 in_register_00000014;
  char *pcVar4;
  ulong uVar5;
  uint minPeriods;
  uint num;
  uint local_4c;
  double *local_48;
  undefined4 local_3c;
  uint local_38 [2];
  
  pcm = self->pcm;
  local_48 = *(double **)CONCAT44(in_register_00000014,primeBuffers);
  local_3c = 2;
  iVar1 = snd_pcm_hw_params_any(pcm);
  if (iVar1 < 0) {
    PaAlsaStreamComponent_InitialConfigure_cold_5();
  }
  else {
    iVar1 = snd_pcm_hw_params_set_periods_integer(pcm,params);
    if (iVar1 < 0) {
      PaAlsaStreamComponent_InitialConfigure_cold_4();
    }
    else {
      local_38[1] = 0;
      iVar1 = snd_pcm_hw_params_set_periods_min(pcm,params,&local_3c);
      if (iVar1 < 0) {
        PaAlsaStreamComponent_InitialConfigure_cold_3();
      }
      else {
        if (self->userInterleaved == 0) {
          iVar1 = 1;
          iVar2 = snd_pcm_hw_params_test_access(pcm,params,1);
          if (iVar2 < 0) {
            uVar3 = snd_pcm_hw_params_test_access(pcm,params,0);
            self->canMmap = ~uVar3 >> 0x1f;
            iVar2 = ((int)uVar3 >> 0x1f) * -3;
            iVar1 = ((int)uVar3 >> 0x1f) * -3 + 1;
          }
          else {
            self->canMmap = 1;
            iVar2 = 0;
          }
        }
        else {
          iVar1 = 0;
          iVar2 = snd_pcm_hw_params_test_access(pcm,params,0);
          if (iVar2 < 0) {
            uVar3 = snd_pcm_hw_params_test_access(pcm,params,1);
            self->canMmap = ~uVar3 >> 0x1f;
            iVar2 = ((int)uVar3 >> 0x1f) * -3 + 1;
            iVar1 = ((int)uVar3 >> 0x1f) * -3;
          }
          else {
            self->canMmap = 1;
            iVar2 = 1;
          }
        }
        iVar1 = snd_pcm_hw_params_set_access(pcm,params,iVar1);
        if (iVar1 < 0) {
          iVar1 = snd_pcm_hw_params_set_access(pcm,params,iVar2);
          if (iVar1 < 0) {
            pcVar4 = (char *)snd_strerror(iVar1);
            PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,pcVar4);
            return -9999;
          }
          self->hostInterleaved = (uint)(self->userInterleaved == 0);
        }
        iVar1 = snd_pcm_hw_params_set_format(pcm,params,self->nativeFormat);
        if (-1 < iVar1) {
          iVar1 = SetApproximateSampleRate(pcm,(snd_pcm_hw_params_t *)params,(double)local_48);
          if (iVar1 == -9999) {
            paUtilErr_ = -9999;
            pcVar4 = 
            "Expression \'paUnanticipatedHostError\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2048\n"
            ;
          }
          else {
            local_4c = 1;
            if (params == (PaStreamParameters *)0x0) {
              __assert_fail("hwParams",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                            ,0xc98,"int GetExactSampleRate(snd_pcm_hw_params_t *, double *)");
            }
            iVar2 = snd_pcm_hw_params_get_rate_numden(params,local_38,&local_4c);
            if (iVar2 < 0) {
              PaAlsaStreamComponent_InitialConfigure_cold_1();
              return -9999;
            }
            if (iVar1 != -0x270d) {
              uVar5 = (ulong)local_4c;
              local_48 = (double *)CONCAT44(in_register_00000014,primeBuffers);
              iVar2 = snd_pcm_hw_params_set_channels(pcm,params,self->numHostChannels);
              if (iVar2 < 0) {
                PaUtil_DebugPrint(
                                 "Expression \'alsa_snd_pcm_hw_params_set_channels( pcm, hwParams, self->numHostChannels )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2051\n"
                                 );
                return -0x270e;
              }
              *local_48 = (double)local_38[0] / (double)uVar5;
              return iVar1;
            }
            paUtilErr_ = -0x270d;
            pcVar4 = 
            "Expression \'paInvalidSampleRate\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2043\n"
            ;
          }
          PaUtil_DebugPrint(pcVar4);
          return paUtilErr_;
        }
        PaAlsaStreamComponent_InitialConfigure_cold_2();
      }
    }
  }
  return -9999;
}

Assistant:

static PaError PaAlsaStreamComponent_InitialConfigure( PaAlsaStreamComponent *self, const PaStreamParameters *params,
        int primeBuffers, snd_pcm_hw_params_t *hwParams, double *sampleRate )
{
    /* Configuration consists of setting all of ALSA's parameters.
     * These parameters come in two flavors: hardware parameters
     * and software paramters.  Hardware parameters will affect
     * the way the device is initialized, software parameters
     * affect the way ALSA interacts with me, the user-level client.
     */

    PaError result = paNoError;
    snd_pcm_access_t accessMode, alternateAccessMode;
    int dir = 0;
    snd_pcm_t *pcm = self->pcm;
    double sr = *sampleRate;
    unsigned int minPeriods = 2;

    /* self->framesPerPeriod = framesPerHostBuffer; */

    /* ... fill up the configuration space with all possibile
     * combinations of parameters this device will accept */
    ENSURE_( alsa_snd_pcm_hw_params_any( pcm, hwParams ), paUnanticipatedHostError );

    ENSURE_( alsa_snd_pcm_hw_params_set_periods_integer( pcm, hwParams ), paUnanticipatedHostError );
    /* I think there should be at least 2 periods (even though ALSA doesn't appear to enforce this) */
    dir = 0;
    ENSURE_( alsa_snd_pcm_hw_params_set_periods_min( pcm, hwParams, &minPeriods, &dir ), paUnanticipatedHostError );

    if( self->userInterleaved )
    {
        accessMode          = SND_PCM_ACCESS_MMAP_INTERLEAVED;
        alternateAccessMode = SND_PCM_ACCESS_MMAP_NONINTERLEAVED;

        /* test if MMAP supported */
        self->canMmap = alsa_snd_pcm_hw_params_test_access( pcm, hwParams, accessMode ) >= 0 ||
                        alsa_snd_pcm_hw_params_test_access( pcm, hwParams, alternateAccessMode ) >= 0;

        PA_DEBUG(( "%s: device MMAP SND_PCM_ACCESS_MMAP_INTERLEAVED: %s\n", __FUNCTION__, ( alsa_snd_pcm_hw_params_test_access( pcm, hwParams, accessMode ) >= 0 ? "YES" : "NO" ) ));
        PA_DEBUG(( "%s: device MMAP SND_PCM_ACCESS_MMAP_NONINTERLEAVED: %s\n", __FUNCTION__, ( alsa_snd_pcm_hw_params_test_access( pcm, hwParams, alternateAccessMode ) >= 0 ? "YES" : "NO" ) ));

        if( !self->canMmap )
        {
            accessMode          = SND_PCM_ACCESS_RW_INTERLEAVED;
            alternateAccessMode = SND_PCM_ACCESS_RW_NONINTERLEAVED;
        }
    }
    else
    {
        accessMode          = SND_PCM_ACCESS_MMAP_NONINTERLEAVED;
        alternateAccessMode = SND_PCM_ACCESS_MMAP_INTERLEAVED;

        /* test if MMAP supported */
        self->canMmap = alsa_snd_pcm_hw_params_test_access( pcm, hwParams, accessMode ) >= 0 ||
                        alsa_snd_pcm_hw_params_test_access( pcm, hwParams, alternateAccessMode ) >= 0;

        PA_DEBUG((" %s: device MMAP SND_PCM_ACCESS_MMAP_NONINTERLEAVED: %s\n", __FUNCTION__, ( alsa_snd_pcm_hw_params_test_access( pcm, hwParams, accessMode ) >= 0 ? "YES" : "NO" ) ));
        PA_DEBUG(( "%s: device MMAP SND_PCM_ACCESS_MMAP_INTERLEAVED: %s\n", __FUNCTION__, ( alsa_snd_pcm_hw_params_test_access( pcm, hwParams, alternateAccessMode ) >= 0 ? "YES" : "NO" ) ));

        if( !self->canMmap )
        {
            accessMode          = SND_PCM_ACCESS_RW_NONINTERLEAVED;
            alternateAccessMode = SND_PCM_ACCESS_RW_INTERLEAVED;
        }
    }

    PA_DEBUG(( "%s: device can MMAP: %s\n", __FUNCTION__, ( self->canMmap ? "YES" : "NO" ) ));

    /* If requested access mode fails, try alternate mode */
    if( alsa_snd_pcm_hw_params_set_access( pcm, hwParams, accessMode ) < 0 )
    {
        int err = 0;
        if( ( err = alsa_snd_pcm_hw_params_set_access( pcm, hwParams, alternateAccessMode )) < 0 )
        {
            result = paUnanticipatedHostError;
            PaUtil_SetLastHostErrorInfo( paALSA, err, alsa_snd_strerror( err ) );
            goto error;
        }
        /* Flip mode */
        self->hostInterleaved = !self->userInterleaved;
    }

    /* Some specific hardware (reported: Audio8 DJ) can fail with assertion during this step. */
    ENSURE_( alsa_snd_pcm_hw_params_set_format( pcm, hwParams, self->nativeFormat ), paUnanticipatedHostError );

    if( ( result = SetApproximateSampleRate( pcm, hwParams, sr )) != paUnanticipatedHostError )
    {
        ENSURE_( GetExactSampleRate( hwParams, &sr ), paUnanticipatedHostError );
        if( result == paInvalidSampleRate ) /* From the SetApproximateSampleRate() call above */
        { /* The sample rate was returned as 'out of tolerance' of the one requested */
            PA_DEBUG(( "%s: Wanted %.3f, closest sample rate was %.3f\n", __FUNCTION__, sampleRate, sr ));
            PA_ENSURE( paInvalidSampleRate );
        }
    }
    else
    {
       PA_ENSURE( paUnanticipatedHostError );
    }

    ENSURE_( alsa_snd_pcm_hw_params_set_channels( pcm, hwParams, self->numHostChannels ), paInvalidChannelCount );

    *sampleRate = sr;

end:
    return result;

error:
    /* No particular action */
    goto end;
}